

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O2

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  int iVar2;
  uv_thread_t uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_thread_t threads [4];
  uv_barrier_t barrier;
  
  iVar1 = uv_barrier_init(&barrier,5);
  uVar3 = (uv_thread_t)iVar1;
  threads[0] = uVar3;
  if (uVar3 == 0) {
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
      iVar1 = uv_thread_create((uv_thread_t *)((long)threads + lVar6),serial_worker,&barrier);
      uVar3 = (uv_thread_t)iVar1;
      if (uVar3 != 0) {
        pcVar5 = "uv_thread_create(&threads[i], serial_worker, &barrier)";
        uVar4 = 0x8b;
        goto LAB_00113178;
      }
    }
    iVar1 = 6;
    do {
      iVar2 = uv_barrier_wait(&barrier);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    if (0 < iVar2) {
      uv_barrier_destroy(&barrier);
    }
    lVar6 = 0;
    while( true ) {
      if (lVar6 == 0x20) {
        return 0;
      }
      iVar1 = uv_thread_join((uv_thread_t *)((long)threads + lVar6));
      uVar3 = (uv_thread_t)iVar1;
      if (uVar3 != 0) break;
      lVar6 = lVar6 + 8;
    }
    pcVar5 = "uv_thread_join(&threads[i])";
    uVar4 = 0x93;
  }
  else {
    pcVar5 = "uv_barrier_init(&barrier, (sizeof(threads) / sizeof((threads)[0])) + 1)";
    uVar4 = 0x88;
  }
LAB_00113178:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-barrier.c"
          ,uVar4,pcVar5,"==","0",uVar3,"==",0);
  abort();
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT_OK(uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_create(&threads[i], serial_worker, &barrier));

  for (i = 0; i < 5; i++)
    uv_barrier_wait(&barrier);
  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_join(&threads[i]));

  return 0;
}